

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

int __thiscall duckdb_re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  Inst *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  Frag FVar9;
  
  FVar9 = FindByteRange(this,root,id);
  uVar6 = FVar9.begin;
  if (uVar6 == 0) {
    uVar7 = AllocInst(this,1);
    if (-1 < (int)uVar7) {
      Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                          uVar7,root,id);
      return uVar7;
    }
  }
  else {
    uVar8 = FVar9._0_8_ >> 0x20;
    uVar7 = root;
    if (uVar8 != 0) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      if ((uVar8 & 1) == 0) {
        uVar7 = pIVar1[(int)uVar6].out_opcode_ >> 4;
      }
      else {
        uVar7 = pIVar1[(int)uVar6].field_1.cap_;
      }
    }
    bVar2 = IsCachedRuneByteSuffix(this,uVar7);
    uVar3 = uVar7;
    uVar5 = root;
    if (bVar2) {
      uVar3 = AllocInst(this,1);
      if ((int)uVar3 < 0) {
        return 0;
      }
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      Prog::Inst::InitByteRange
                (pIVar1 + uVar3,(uint)pIVar1[(int)uVar7].field_1.byte_range.lo_,
                 (uint)pIVar1[(int)uVar7].field_1.byte_range.hi_,
                 pIVar1[(int)uVar7].field_1.byte_range.hint_foldcase_ & 1,
                 pIVar1[(int)uVar7].out_opcode_ >> 4);
      uVar5 = uVar3;
      if (uVar8 != 0) {
        pIVar1 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        if ((uVar8 & 1) == 0) {
          pIVar1[(int)uVar6].out_opcode_ = pIVar1[(int)uVar6].out_opcode_ & 0xf | uVar3 << 4;
          uVar5 = root;
        }
        else {
          pIVar1[(int)uVar6].field_1.cap_ = uVar3;
          uVar5 = root;
        }
      }
    }
    uVar7 = (this->inst_).ptr_._M_t.
            super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
            .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl[id].out_opcode_;
    bVar2 = IsCachedRuneByteSuffix(this,id);
    if (!bVar2) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + id;
      pIVar1->out_opcode_ = 0;
      pIVar1->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
      this->ninst_ = this->ninst_ + -1;
    }
    iVar4 = AddSuffixRecursive(this,(this->inst_).ptr_._M_t.
                                    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                    .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>.
                                    _M_head_impl[(int)uVar3].out_opcode_ >> 4,uVar7 >> 4);
    if (iVar4 != 0) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      pIVar1[(int)uVar3].out_opcode_ = pIVar1[(int)uVar3].out_opcode_ & 0xf | iVar4 << 4;
      return uVar5;
    }
  }
  return 0;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.head == 0)
    br = root;
  else if (f.end.head&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.head == 0)
      root = br;
    else if (f.end.head&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, ninst_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    ninst_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}